

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O1

bool __thiscall
iutest::detail::IParamTestSuiteInfo::is_same
          (IParamTestSuiteInfo *this,string *base_name,string *package_name)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = (this->m_testsuite_base_name)._M_string_length;
  if ((sVar1 == base_name->_M_string_length) &&
     (((sVar1 == 0 ||
       (iVar2 = bcmp((this->m_testsuite_base_name)._M_dataplus._M_p,(base_name->_M_dataplus)._M_p,
                     sVar1), iVar2 == 0)) &&
      (sVar1 = (this->m_package_name)._M_string_length, sVar1 == package_name->_M_string_length))))
  {
    if (sVar1 != 0) {
      iVar2 = bcmp((this->m_package_name)._M_dataplus._M_p,(package_name->_M_dataplus)._M_p,sVar1);
      return iVar2 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool is_same(const ::std::string& base_name, const ::std::string& package_name)
    {
        return m_testsuite_base_name == base_name && m_package_name == package_name;
    }